

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare::operator()
          (ExtensionCompare *this,ExtensionEntry *a,ExtensionEntry *b)

{
  bool bVar1;
  string_view local_70;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_60;
  string_view local_48;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_38;
  ExtensionEntry *local_20;
  ExtensionEntry *b_local;
  ExtensionEntry *a_local;
  ExtensionCompare *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (ExtensionEntry *)this;
  local_48 = ExtensionEntry::extendee(a,this->index);
  std::make_tuple<std::basic_string_view<char,std::char_traits<char>>,int_const&>
            (&local_38,&local_48,&b_local->extension_number);
  local_70 = ExtensionEntry::extendee(local_20,this->index);
  std::make_tuple<std::basic_string_view<char,std::char_traits<char>>,int_const&>
            (&local_60,&local_70,&local_20->extension_number);
  bVar1 = std::operator<(&local_38,&local_60);
  return bVar1;
}

Assistant:

bool operator()(const ExtensionEntry& a, const ExtensionEntry& b) const {
      return std::make_tuple(a.extendee(index), a.extension_number) <
             std::make_tuple(b.extendee(index), b.extension_number);
    }